

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instruction.hpp
# Opt level: O0

Operation InstructionSet::x86::rep_operation<(InstructionSet::x86::Model)3>
                    (Operation operation,Repetition repetition)

{
  Operation local_15;
  Operation local_13;
  Operation local_11;
  Operation local_f;
  Operation local_d;
  Operation local_9;
  Repetition repetition_local;
  Operation operation_local;
  
  local_9 = operation;
  if (operation != IDIV) {
    if (operation == MOVS) {
      local_13 = MOVS_REP;
      if (repetition == None) {
        local_13 = MOVS;
      }
      local_9 = local_13;
    }
    else if (operation == LODS) {
      local_11 = LODS_REP;
      if (repetition == None) {
        local_11 = LODS;
      }
      local_9 = local_11;
    }
    else if (operation == STOS) {
      local_15 = STOS_REP;
      if (repetition == None) {
        local_15 = STOS;
      }
      local_9 = local_15;
    }
    else if (operation == CMPS) {
      if (repetition == None) {
        local_9 = CMPS;
      }
      else if ((repetition == RepE) || (repetition != RepNE)) {
        local_9 = CMPS_REPE;
      }
      else {
        local_9 = CMPS_REPNE;
      }
    }
    else if (operation == SCAS) {
      if (repetition == None) {
        local_9 = SCAS;
      }
      else if ((repetition == RepE) || (repetition != RepNE)) {
        local_9 = SCAS_REPE;
      }
      else {
        local_9 = SCAS_REPNE;
      }
    }
    else if (operation == INS) {
      local_d = INS_REP;
      if (repetition == None) {
        local_d = INS;
      }
      local_9 = local_d;
    }
    else if (operation == OUTS) {
      local_f = OUTS_REP;
      if (repetition == None) {
        local_f = OUTS;
      }
      local_9 = local_f;
    }
  }
  return local_9;
}

Assistant:

constexpr Operation rep_operation(Operation operation, Repetition repetition) {
	switch(operation) {
		case Operation::IDIV:
			if constexpr (model == Model::i8086) {
				return repetition != Repetition::None ? Operation::IDIV_REP : Operation::IDIV;
			}
		[[fallthrough]];

		default: return operation;

		case Operation::INS:
			return repetition != Repetition::None ? Operation::INS_REP : Operation::INS;
		case Operation::OUTS:
			return repetition != Repetition::None ? Operation::OUTS_REP : Operation::OUTS;
		case Operation::LODS:
			return repetition != Repetition::None ? Operation::LODS_REP : Operation::LODS;
		case Operation::MOVS:
			return repetition != Repetition::None ? Operation::MOVS_REP : Operation::MOVS;
		case Operation::STOS:
			return repetition != Repetition::None ? Operation::STOS_REP : Operation::STOS;

		case Operation::CMPS:
			switch(repetition) {
				case Repetition::None:	return Operation::CMPS;
				default:
				case Repetition::RepE:	return Operation::CMPS_REPE;
				case Repetition::RepNE:	return Operation::CMPS_REPNE;
			}

		case Operation::SCAS:
			switch(repetition) {
				case Repetition::None:	return Operation::SCAS;
				default:
				case Repetition::RepE:	return Operation::SCAS_REPE;
				case Repetition::RepNE:	return Operation::SCAS_REPNE;
			}
	}
}